

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

string * __thiscall pbrt::TextureSceneEntity::ToString_abi_cxx11_(TextureSceneEntity *this)

{
  string *in_RDI;
  AnimatedTransform *in_stack_00000008;
  FileLoc *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  char *in_stack_00000028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000040;
  
  StringPrintf<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&,pbrt::AnimatedTransform_const&,std::__cxx11::string_const&>
            (in_stack_00000028,in_stack_00000020,(ParameterDictionary *)this,in_stack_00000010,
             in_stack_00000008,in_stack_00000040);
  return in_RDI;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ TextureSeneEntity name: %s parameters: %s loc: %s "
                            "renderFromObject: %s texName: %s ]",
                            name, parameters, loc, renderFromObject, texName);
    }